

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O0

void __thiscall
MeshDenoisingViaL0Minimization::getInitialVerticesMatrix
          (MeshDenoisingViaL0Minimization *this,TriMesh *noisy_mesh,
          MatrixXd *initial_vertices_matrix)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  BaseHandle *this_00;
  reference pvVar4;
  Point *pPVar5;
  double *pdVar6;
  Scalar *pSVar7;
  undefined1 local_60 [8];
  Point p;
  undefined1 auStack_40 [4];
  int index;
  undefined1 local_30 [8];
  VertexIter v_it;
  MatrixXd *initial_vertices_matrix_local;
  TriMesh *noisy_mesh_local;
  MeshDenoisingViaL0Minimization *this_local;
  
  v_it._8_8_ = initial_vertices_matrix;
  iVar3 = (**(code **)(*(long *)&(noisy_mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x10))();
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&initial_vertices_matrix->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,(long)iVar3,3);
  _local_30 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)noisy_mesh);
  while( true ) {
    _auStack_40 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)noisy_mesh);
    bVar2 = OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
            ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                          *)local_30,
                         (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                          *)auStack_40);
    if (!bVar2) break;
    this_00 = &OpenMesh::Iterators::
               GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
               ::operator->((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                             *)local_30)->super_BaseHandle;
    p.super_VectorDataT<double,_3>.values_[2]._4_4_ = OpenMesh::BaseHandle::idx(this_00);
    pvVar4 = OpenMesh::Iterators::
             GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
             ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                          *)local_30);
    pPVar5 = OpenMesh::
             AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
             point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                    *)noisy_mesh,(VertexHandle)(pvVar4->super_BaseHandle).idx_);
    local_60 = (undefined1  [8])(pPVar5->super_VectorDataT<double,_3>).values_[0];
    p.super_VectorDataT<double,_3>.values_[0] = (pPVar5->super_VectorDataT<double,_3>).values_[1];
    p.super_VectorDataT<double,_3>.values_[1] = (pPVar5->super_VectorDataT<double,_3>).values_[2];
    pdVar6 = OpenMesh::VectorT<double,_3>::operator[]((VectorT<double,_3> *)local_60,0);
    dVar1 = *pdVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)v_it._8_8_,
                        (long)p.super_VectorDataT<double,_3>.values_[2]._4_4_,0);
    *pSVar7 = dVar1;
    pdVar6 = OpenMesh::VectorT<double,_3>::operator[]((VectorT<double,_3> *)local_60,1);
    dVar1 = *pdVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)v_it._8_8_,
                        (long)p.super_VectorDataT<double,_3>.values_[2]._4_4_,1);
    *pSVar7 = dVar1;
    pdVar6 = OpenMesh::VectorT<double,_3>::operator[]((VectorT<double,_3> *)local_60,2);
    dVar1 = *pdVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)v_it._8_8_,
                        (long)p.super_VectorDataT<double,_3>.values_[2]._4_4_,2);
    *pSVar7 = dVar1;
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                  *)local_30,0);
  }
  return;
}

Assistant:

void MeshDenoisingViaL0Minimization::getInitialVerticesMatrix(TriMesh &noisy_mesh, Eigen::MatrixXd &initial_vertices_matrix)
{
    initial_vertices_matrix.resize((int)noisy_mesh.n_vertices(), 3);

    for(TriMesh::VertexIter v_it = noisy_mesh.vertices_begin(); v_it != noisy_mesh.vertices_end(); v_it++)
    {
        int index = v_it->idx();
        TriMesh::Point p = noisy_mesh.point(*v_it);
        initial_vertices_matrix(index, 0) = p[0];
        initial_vertices_matrix(index, 1) = p[1];
        initial_vertices_matrix(index, 2) = p[2];
    }
}